

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

void __thiscall CEPlanet::UpdateCoordinates(CEPlanet *this,double new_jd)

{
  reference pvVar1;
  double x;
  double y;
  vector<double,_std::allocator<double>_> pos_delayed;
  CEDate date;
  double local_a8;
  CEAngle local_a0;
  CEAngle local_90;
  double local_80;
  double local_78;
  CESkyCoordType local_6c;
  vector<double,_std::allocator<double>_> local_68;
  CEDate local_50;
  
  if (-1e+29 <= new_jd) {
    if ((this->cached_jd_ != new_jd) || (NAN(this->cached_jd_) || NAN(new_jd))) {
      local_78 = new_jd;
      UpdatePosition(this,&local_78);
      CEDate::CEDate(&local_50,new_jd,JD);
      PositionICRS_Obs(&local_68,this,&local_50);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_68,0);
      iauC2s(pvVar1,&local_a8,&local_80);
      local_a8 = (double)iauAnp(local_a8);
      CEAngle::Rad(&local_90,&local_a8);
      CEAngle::Rad(&local_a0,&local_80);
      local_6c = CESkyCoord::GetCoordSystem((CESkyCoord *)this);
      CESkyCoord::SetCoordinates((CESkyCoord *)this,&local_90,&local_a0,&local_6c);
      CEAngle::~CEAngle(&local_a0);
      CEAngle::~CEAngle(&local_90);
      this->cached_jd_ = new_jd;
      std::vector<double,_std::allocator<double>_>::~vector(&local_68);
      CEDate::~CEDate(&local_50);
    }
  }
  return;
}

Assistant:

void CEPlanet::UpdateCoordinates(double new_jd) const
{
    // If no date was supplied, or if the date hasnt changed, do nothing
    if ((new_jd < -1.0e29) || (new_jd == cached_jd_)) return;

    // Update the positions given the current julian date
    UpdatePosition(new_jd);

    CEDate date(new_jd, CEDateType::JD);
    std::vector<double> pos_delayed = PositionICRS_Obs(date);

    // Now compute the actual sky coordinates in ICRS
    double x;
    double y;
    iauC2s(&pos_delayed[0], &x, &y);
    
    // Make sure the x-coordinate is in the appropriate range
    x = iauAnp(x);

    // Update the coordinates
    CESkyCoord::SetCoordinates(CEAngle::Rad(x), CEAngle::Rad(y), GetCoordSystem());

    // Now that the coordinates are updated, reset the time
    cached_jd_ = new_jd ;
}